

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O3

int Ivy_NodeCutDeriveNew(Ivy_Cut_t *pCut,Ivy_Cut_t *pCutNew,int IdOld,int IdNew0,int IdNew1)

{
  ushort uVar1;
  int iVar2;
  short sVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar1 = pCut->nSize;
  if ((short)uVar1 < 1) {
    __assert_fail("pCut->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x270,"int Ivy_NodeCutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)");
  }
  if (IdNew1 <= IdNew0) {
    __assert_fail("IdNew0 < IdNew1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x271,"int Ivy_NodeCutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)");
  }
  uVar8 = 0;
  iVar4 = 0;
  uVar7 = 0;
  do {
    iVar6 = pCut->pArray[uVar8];
    if (iVar6 != IdOld) {
      if (IdNew0 <= iVar6) {
        if (IdNew0 < iVar6) {
          lVar5 = (long)iVar4;
          iVar4 = iVar4 + 1;
          pCutNew->pArray[lVar5] = IdNew0;
          uVar7 = uVar7 | 1 << (((uint)((ulong)((long)IdNew0 * 0x84210843) >> 0x24) -
                                (IdNew0 >> 0x1f)) * -0x1f + IdNew0 & 0x1f);
          iVar6 = pCut->pArray[uVar8];
        }
        IdNew0 = 0x7fffffff;
      }
      iVar2 = IdNew1;
      if ((IdNew1 <= iVar6) && (iVar2 = 0x7fffffff, IdNew1 < iVar6)) {
        lVar5 = (long)iVar4;
        iVar4 = iVar4 + 1;
        pCutNew->pArray[lVar5] = IdNew1;
        uVar7 = uVar7 | 1 << (((uint)((ulong)((long)IdNew1 * 0x84210843) >> 0x24) - (IdNew1 >> 0x1f)
                              ) * -0x1f + IdNew1 & 0x1f);
        iVar6 = pCut->pArray[uVar8];
      }
      IdNew1 = iVar2;
      lVar5 = (long)iVar4;
      iVar4 = iVar4 + 1;
      pCutNew->pArray[lVar5] = iVar6;
      iVar6 = pCut->pArray[uVar8];
      uVar7 = uVar7 | 1 << (((uint)((ulong)((long)iVar6 * 0x84210843) >> 0x24) - (iVar6 >> 0x1f)) *
                            -0x1f + iVar6 & 0x1f);
    }
    uVar8 = uVar8 + 1;
  } while (uVar1 != uVar8);
  if (IdNew0 != 0x7fffffff) {
    lVar5 = (long)iVar4;
    iVar4 = iVar4 + 1;
    pCutNew->pArray[lVar5] = IdNew0;
    uVar7 = uVar7 | 1 << (((uint)((ulong)((long)IdNew0 * 0x84210843) >> 0x24) - (IdNew0 >> 0x1f)) *
                          -0x1f + IdNew0 & 0x1f);
  }
  if (IdNew1 != 0x7fffffff) {
    lVar5 = (long)iVar4;
    iVar4 = iVar4 + 1;
    pCutNew->pArray[lVar5] = IdNew1;
    uVar7 = uVar7 | 1 << (((uint)((ulong)((long)IdNew1 * 0x84210843) >> 0x24) - (IdNew1 >> 0x1f)) *
                          -0x1f + IdNew1 & 0x1f);
  }
  sVar3 = (short)iVar4;
  pCutNew->nSize = sVar3;
  pCutNew->uHash = uVar7;
  if ((int)pCut->nSizeMax < (int)sVar3) {
    __assert_fail("pCutNew->nSize <= pCut->nSizeMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x297,"int Ivy_NodeCutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)");
  }
  return (int)sVar3;
}

Assistant:

static inline int Ivy_NodeCutDeriveNew( Ivy_Cut_t * pCut, Ivy_Cut_t * pCutNew, int IdOld, int IdNew0, int IdNew1 )
{
    unsigned uHash = 0;
    int i, k; 
    assert( pCut->nSize > 0 );
    assert( IdNew0 < IdNew1 );
    for ( i = k = 0; i < pCut->nSize; i++ )
    {
        if ( pCut->pArray[i] == IdOld )
            continue;
        if ( IdNew0 <= pCut->pArray[i] )
        {
            if ( IdNew0 < pCut->pArray[i] )
            {
                pCutNew->pArray[ k++ ] = IdNew0;
                uHash |= Ivy_NodeCutHashValue( IdNew0 );
            }
            IdNew0 = 0x7FFFFFFF;
        }
        if ( IdNew1 <= pCut->pArray[i] )
        {
            if ( IdNew1 < pCut->pArray[i] )
            {
                pCutNew->pArray[ k++ ] = IdNew1;
                uHash |= Ivy_NodeCutHashValue( IdNew1 );
            }
            IdNew1 = 0x7FFFFFFF;
        }
        pCutNew->pArray[ k++ ] = pCut->pArray[i];
        uHash |= Ivy_NodeCutHashValue( pCut->pArray[i] );
    }
    if ( IdNew0 < 0x7FFFFFFF )
    {
        pCutNew->pArray[ k++ ] = IdNew0;
        uHash |= Ivy_NodeCutHashValue( IdNew0 );
    }
    if ( IdNew1 < 0x7FFFFFFF )
    {
        pCutNew->pArray[ k++ ] = IdNew1;
        uHash |= Ivy_NodeCutHashValue( IdNew1 );
    }
    pCutNew->nSize = k;
    pCutNew->uHash = uHash;
    assert( pCutNew->nSize <= pCut->nSizeMax );
//    for ( i = 1; i < pCutNew->nSize; i++ )
//        assert( pCutNew->pArray[i-1] < pCutNew->pArray[i] );
    return 1;
}